

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

hugeint_t __thiscall
duckdb::Interpolator<true>::
Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
          (Interpolator<true> *this,hugeint_t *v_t,Vector *result,
          QuantileDirect<duckdb::hugeint_t> *accessor)

{
  bool bVar1;
  InvalidInputException *this_00;
  int64_t iVar2;
  RESULT_TYPE input;
  hugeint_t input_00;
  hugeint_t result_1;
  hugeint_t local_50;
  string local_40;
  
  input = InterpolateInternal<duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
                    (this,v_t,accessor);
  input_00.lower = input.upper;
  iVar2 = 0;
  bVar1 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input,&local_50,false);
  if (bVar1) {
    return local_50;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.upper = iVar2;
  CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_40,(duckdb *)input.lower,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}